

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_player_prop(parser *p)

{
  player_bound_ui *ppVar1;
  embryo_player_ability *peVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  player_ability *ppVar6;
  char *name;
  uint16_t n;
  uint16_t i;
  player_ability *previous;
  player_ability *new;
  player_bound_ui *boundui_cursor;
  embryo_player_ability *target;
  embryo_player_ability *embryo;
  parser *p_local;
  
  target = embryo_player_abilities;
  embryo_player_abilities = (embryo_player_ability *)0x0;
  player_abilities = (player_ability *)mem_zalloc(0x30);
  previous = player_abilities;
  while (target != (embryo_player_ability *)0x0) {
    iVar3 = strcmp((target->ability).type,"element");
    if (iVar3 == 0) {
      for (name._6_2_ = 0; name._6_2_ < 0x19; name._6_2_ = name._6_2_ + 1) {
        pcVar4 = string_make(projections[name._6_2_].name);
        previous->index = name._6_2_;
        pcVar5 = string_make((target->ability).type);
        previous->type = pcVar5;
        pcVar5 = format("%s %s.",(target->ability).desc,pcVar4);
        pcVar5 = string_make(pcVar5);
        previous->desc = pcVar5;
        my_strcap(pcVar4);
        pcVar5 = format("%s %s",pcVar4,(target->ability).name);
        pcVar5 = string_make(pcVar5);
        previous->name = pcVar5;
        string_free(pcVar4);
        previous->value = (target->ability).value;
        for (new = (player_ability *)target->boundui; new != (player_ability *)0x0;
            new = *(player_ability **)&new->index) {
          pcVar4 = format("%s<%s>",new->next,list_element_names[name._6_2_]);
          pcVar4 = string_make(pcVar4);
          bind_player_ability_to_ui_entry_by_name
                    (pcVar4,previous,*(wchar_t *)&new->type,
                     (_Bool)((*(byte *)((long)&new->type + 5) ^ 0xff) & 1),
                     (_Bool)(*(byte *)((long)&new->type + 4) & 1));
          string_free(pcVar4);
        }
        if ((name._6_2_ != 0x18) || (target->next != (embryo_player_ability *)0x0)) {
          ppVar6 = (player_ability *)mem_zalloc(0x30);
          previous->next = ppVar6;
          previous = ppVar6;
        }
      }
      string_free((target->ability).type);
      string_free((target->ability).desc);
      string_free((target->ability).name);
      while (target->boundui != (player_bound_ui *)0x0) {
        ppVar1 = target->boundui;
        target->boundui = target->boundui->next;
        string_free(ppVar1->name);
        mem_free(ppVar1);
      }
    }
    else {
      previous->type = (target->ability).type;
      previous->index = (target->ability).index;
      previous->desc = (target->ability).desc;
      previous->name = (target->ability).name;
      while (target->boundui != (player_bound_ui *)0x0) {
        ppVar1 = target->boundui;
        target->boundui = target->boundui->next;
        bind_player_ability_to_ui_entry_by_name
                  (ppVar1->name,previous,ppVar1->value,(_Bool)((ppVar1->isspecial ^ 0xffU) & 1),
                   (_Bool)(ppVar1->isaux & 1));
        string_free(ppVar1->name);
        mem_free(ppVar1);
      }
      if (target->next != (embryo_player_ability *)0x0) {
        ppVar6 = (player_ability *)mem_zalloc(0x30);
        previous->next = ppVar6;
        previous = ppVar6;
      }
    }
    peVar2 = target->next;
    mem_free(target);
    target = peVar2;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_player_prop(struct parser *p) {
	struct embryo_player_ability *embryo = embryo_player_abilities;
	struct embryo_player_ability *target;
	struct player_bound_ui *boundui_cursor;
	struct player_ability *new, *previous = NULL;

	embryo_player_abilities = NULL;
	/* Copy abilities over, making multiple copies for element types */
	player_abilities = mem_zalloc(sizeof(*player_abilities));
	new = player_abilities;
	while (embryo) {
		if (streq(embryo->ability.type, "element")) {
			uint16_t i, n;
			assert(N_ELEMENTS(list_element_names) < 65536);
			n = (uint16_t) N_ELEMENTS(list_element_names);
			for (i = 0; i < n - 1; i++) {
				char *name = string_make(projections[i].name);
				new->index = i;
				new->type = string_make(embryo->ability.type);
				new->desc = string_make(format("%s %s.", embryo->ability.desc, name));
				my_strcap(name);
				new->name = string_make(format("%s %s", name, embryo->ability.name));
				string_free(name);
				new->value = embryo->ability.value;
				boundui_cursor = embryo->boundui;
				while (boundui_cursor) {
					name = string_make(format("%s<%s>", boundui_cursor->name, list_element_names[i]));
					(void) bind_player_ability_to_ui_entry_by_name(name, new, boundui_cursor->value, !boundui_cursor->isspecial, boundui_cursor->isaux);
					string_free(name);
					boundui_cursor = boundui_cursor->next;
				}
				if ((i != n - 2) || embryo->next) {
					previous = new;
					new = mem_zalloc(sizeof(*new));
					previous->next = new;
				}
			}
			string_free(embryo->ability.type);
			string_free(embryo->ability.desc);
			string_free(embryo->ability.name);
			while (embryo->boundui) {
				boundui_cursor = embryo->boundui;
				embryo->boundui = embryo->boundui->next;
				string_free(boundui_cursor->name);
				mem_free(boundui_cursor);
			}
		} else {
			new->type = embryo->ability.type;
			new->index = embryo->ability.index;
			new->desc = embryo->ability.desc;
			new->name = embryo->ability.name;
			while (embryo->boundui) {
				boundui_cursor = embryo->boundui;
				embryo->boundui = embryo->boundui->next;
				(void) bind_player_ability_to_ui_entry_by_name(boundui_cursor->name, new, boundui_cursor->value, !boundui_cursor->isspecial, boundui_cursor->isaux);
				string_free(boundui_cursor->name);
				mem_free(boundui_cursor);
			}
			if (embryo->next) {
				previous = new;
				new = mem_zalloc(sizeof(*new));
				previous->next = new;
			}
		}
		target = embryo;
		embryo = embryo->next;
		mem_free(target);
	}
	parser_destroy(p);
	return 0;
}